

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcWallType::~IfcWallType(IfcWallType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x921c10;
  *(undefined8 *)&this->field_0x30 = 0x921d28;
  *(undefined8 *)&this[-1].field_0xd0 = 0x921c38;
  *(undefined8 *)&this[-1].field_0xe0 = 0x921c60;
  *(undefined8 *)&this[-1].field_0x138 = 0x921c88;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x921cb0;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x921cd8;
  *(undefined8 *)this = 0x921d00;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x921ff0;
  *(undefined8 *)&this->field_0x30 = 0x9220b8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x922018;
  *(undefined8 *)&this[-1].field_0xe0 = 0x922040;
  *(undefined8 *)&this[-1].field_0x138 = 0x922068;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x922090;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWallType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00921d50);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcWallType() : Object("IfcWallType") {}